

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

Expression * __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::removeAt
          (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this,size_t index)

{
  Expression *pEVar1;
  size_t sVar2;
  ulong local_28;
  size_t i;
  Expression *item;
  size_t index_local;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_local;
  
  sVar2 = size(this);
  if (index < sVar2) {
    pEVar1 = this->data[index];
    local_28 = index;
    while( true ) {
      sVar2 = size(this);
      if (sVar2 - 1 <= local_28) break;
      this->data[local_28] = this->data[local_28 + 1];
      local_28 = local_28 + 1;
    }
    sVar2 = size(this);
    resize(this,sVar2 - 1);
    return pEVar1;
  }
  __assert_fail("index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                ,0x17a,
                "T ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::removeAt(size_t) [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
}

Assistant:

T removeAt(size_t index) {
    assert(index < size());
    auto item = data[index];
    for (auto i = index; i < size() - 1; ++i) {
      data[i] = data[i + 1];
    }
    resize(size() - 1);
    return item;
  }